

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_file.cpp
# Opt level: O2

void __thiscall libtorrent::aux::part_file::flush_metadata_impl(part_file *this,error_code *ec)

{
  bool bVar1;
  iterator iVar2;
  int data;
  error_code *in_R9;
  string_view lhs;
  span<const_char> buf;
  string_view rhs;
  file_handle f;
  key_type local_64;
  vector<char,_std::allocator<char>_> header;
  char *ptr;
  undefined8 local_38;
  
  if (this->m_dirty_metadata != false) {
    if ((this->m_piece_map)._M_h._M_element_count == 0) {
      lhs._M_str = (char *)(this->m_name)._M_string_length;
      lhs._M_len = (size_t)(this->m_path)._M_dataplus._M_p;
      rhs._M_str = (char *)in_R9;
      rhs._M_len = (size_t)(this->m_name)._M_dataplus._M_p;
      combine_path_abi_cxx11_
                ((string *)&header,(libtorrent *)(this->m_path)._M_string_length,lhs,rhs);
      remove((libtorrent *)&header,(char *)ec);
      _ptr = boost::system::errc::make_error_condition(no_such_file_or_directory);
      bVar1 = boost::system::operator==(ec,(error_condition *)&ptr);
      if (bVar1) {
        ec->val_ = 0;
        ec->failed_ = false;
        ec->cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                    super_error_category;
      }
      ::std::__cxx11::string::~string((string *)&header);
    }
    else {
      open_file((part_file *)&f,(open_mode_t)(uint)this,(error_code *)0x21);
      if (ec->failed_ == false) {
        ::std::vector<char,_std::allocator<char>_>::vector
                  (&header,(long)this->m_header_size,(allocator_type *)&ptr);
        ptr = header.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
              ._M_start;
        write_impl<unsigned_int,int,char*>(this->m_max_pieces,&ptr);
        write_impl<unsigned_int,int,char*>(this->m_piece_size,&ptr);
        for (local_64.m_val = 0; local_64.m_val < this->m_max_pieces;
            local_64.m_val = local_64.m_val + 1) {
          iVar2 = ::std::
                  _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&(this->m_piece_map)._M_h,&local_64);
          data = -1;
          if (iVar2.
              super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
              ._M_cur != (__node_type *)0x0) {
            data = *(int *)((long)iVar2.
                                  super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
                                  ._M_cur + 0xc);
          }
          write_impl<int,int,char*>(data,&ptr);
        }
        memset(ptr,0,(size_t)(header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start +
                             ((long)this->m_header_size - (long)ptr)));
        buf.m_ptr = (long)header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start;
        buf.m_len = 0;
        pwrite_all((aux *)(ulong)(uint)f.m_fd,
                   (handle_type)
                   header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,buf,(int64_t)ec,in_R9);
        if (ec->failed_ == false) {
          this->m_dirty_metadata = false;
        }
        ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  (&header.super__Vector_base<char,_std::allocator<char>_>);
      }
      file_handle::~file_handle(&f);
    }
  }
  return;
}

Assistant:

void part_file::flush_metadata_impl(error_code& ec)
	{
		// do we need to flush the metadata?
		if (m_dirty_metadata == false) return;

		if (m_piece_map.empty())
		{
			// if we don't have any pieces left in the
			// part file, remove it
			std::string const p = combine_path(m_path, m_name);
			remove(p, ec);

			if (ec == boost::system::errc::no_such_file_or_directory)
				ec.clear();
			return;
		}

		auto f = open_file(aux::open_mode::write | aux::open_mode::hidden, ec);
		if (ec) return;

		std::vector<char> header(static_cast<std::size_t>(m_header_size));

		using namespace libtorrent::aux;

		char* ptr = header.data();
		write_uint32(m_max_pieces, ptr);
		write_uint32(m_piece_size, ptr);

		for (piece_index_t piece(0); piece < piece_index_t(m_max_pieces); ++piece)
		{
			auto const i = m_piece_map.find(piece);
			slot_index_t const slot(i == m_piece_map.end()
				? slot_index_t(-1) : i->second);
			write_int32(static_cast<int>(slot), ptr);
		}
		std::memset(ptr, 0, std::size_t(m_header_size - (ptr - header.data())));
		aux::pwrite_all(f.fd(), header, 0, ec);
		if (ec) return;
		m_dirty_metadata = false;
	}